

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch.cpp
# Opt level: O1

void __thiscall bidfx_public_api::tools::CountdownLatch::CountDown(CountdownLatch *this)

{
  uint32_t uVar1;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->lock;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if ((this->count == 0) || (uVar1 = this->count - 1, this->count = uVar1, uVar1 == 0)) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void CountdownLatch::CountDown()
{
    std::unique_lock<std::mutex> lck(lock);
    if (0 == count)
    {
        cv.notify_all();
        return;
    }
    --count;
    if (0 == count)
    {
        cv.notify_all();
    }
}